

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
       *this,uint u)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  char *buffer;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  buffer = this_00->stackTop_;
  if (this_00->stackEnd_ < buffer + 10) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,10);
    buffer = this_00->stackTop_;
  }
  this_00->stackTop_ = buffer + 10;
  pcVar1 = internal::u32toa(u,buffer);
  (this->os_->stack_).stackTop_ =
       pcVar1 + (long)((this->os_->stack_).stackTop_ + (-10 - (long)buffer));
  return true;
}

Assistant:

bool Uint(unsigned u)       { Prefix(kNumberType); return EndValue(WriteUint(u)); }